

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

void helper_icbi_ppc64(CPUPPCState_conflict2 *env,target_ulong addr)

{
  uintptr_t unaff_retaddr;
  
  cpu_ldl_data_ra_ppc64(env,addr & (long)-env->dcache_line_size,unaff_retaddr);
  return;
}

Assistant:

void helper_icbi(CPUPPCState *env, target_ulong addr)
{
    addr &= ~(env->dcache_line_size - 1);
    /*
     * Invalidate one cache line :
     * PowerPC specification says this is to be treated like a load
     * (not a fetch) by the MMU. To be sure it will be so,
     * do the load "by hand".
     */
    cpu_ldl_data_ra(env, addr, GETPC());
}